

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFrom<google::protobuf::RepeatedPtrField<bloaty::Regex>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *this_00;
  long in_RSI;
  long in_RDI;
  LogMessage *other_00;
  LogMessage *in_stack_ffffffffffffff80;
  LogMessage *in_stack_ffffffffffffff90;
  offset_in_RepeatedPtrFieldBase_to_subr in_stack_ffffffffffffffb8;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffc8;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffd0;
  
  if (in_RSI == in_RDI) {
    other_00 = (LogMessage *)&stack0xffffffffffffffb8;
    LogMessage::LogMessage
              (in_stack_ffffffffffffff90,(LogLevel_conflict)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff80,(int)((ulong)other_00 >> 0x20));
    this_00 = LogMessage::operator<<(in_stack_ffffffffffffff80,(char *)other_00);
    LogFinisher::operator=((LogFinisher *)this_00,other_00);
    LogMessage::~LogMessage((LogMessage *)0x1acbd3);
  }
  if (*(int *)(in_RSI + 8) != 0) {
    MergeFromInternal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8)
    ;
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFrom(const RepeatedPtrFieldBase& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ == 0) return;
  MergeFromInternal(other,
                    &RepeatedPtrFieldBase::MergeFromInnerLoop<TypeHandler>);
}